

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_pgroup_set_default(Integer grp)

{
  undefined8 in_RAX;
  ARMCI_Group parent_grp;
  undefined8 uStack_8;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  GA_Default_Proc_Group = (int)grp;
  if (GA_Default_Proc_Group < 1) {
    uStack_8 = in_RAX;
    ARMCI_Group_get_world((ARMCI_Group *)((long)&uStack_8 + 4));
  }
  else {
    uStack_8 = CONCAT44(PGRP_LIST[GA_Default_Proc_Group & 0x7fffffff].group,(int)in_RAX);
  }
  ARMCI_Group_set_default((ARMCI_Group *)((long)&uStack_8 + 4));
  return;
}

Assistant:

void pnga_pgroup_set_default(Integer grp)
{
#if 0
    int local_sync_begin,local_sync_end;
 
    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
#endif
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
 
    /* force a hang if default group is not being set correctly */
#if 0
    if (local_sync_begin || local_sync_end) pnga_pgroup_sync(grp);
#endif
    GA_Default_Proc_Group = (int)(grp);

#ifdef MSG_COMMS_MPI
    {
       ARMCI_Group parent_grp;
       if(GA_Default_Proc_Group > 0)
          parent_grp = PGRP_LIST[GA_Default_Proc_Group].group;
       else
          ARMCI_Group_get_world(&parent_grp);  
       ARMCI_Group_set_default(&parent_grp);
    }
#endif
}